

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

void __thiscall ChebTools::LMatrixLibrary::build(LMatrixLibrary *this,size_t N)

{
  Scalar SVar1;
  Scalar *pSVar2;
  mapped_type *dst;
  int j;
  ulong row;
  int k;
  ulong col;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  MatrixXd L;
  double local_b8;
  size_t local_a0;
  longdouble local_94;
  longdouble local_88;
  longdouble local_7c;
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  double local_58;
  double dStack_50;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_40 = N + 1;
  local_a0 = N;
  local_38 = local_40;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_70,&local_38,&local_40);
  local_88 = (longdouble)(long)N + (longdouble)*(float *)(&DAT_00135580 + (ulong)((long)N < 0) * 4);
  auVar5._8_4_ = (int)(N >> 0x20);
  auVar5._0_8_ = N;
  auVar5._12_4_ = 0x45300000;
  dStack_50 = auVar5._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)N) - 4503599627370496.0);
  local_94 = _DAT_00135620;
  for (row = 0; row <= N; row = row + 1) {
    local_7c = local_94 * (longdouble)(int)row;
    local_b8 = 2.0;
    col = row;
    if (row != 0) {
      local_b8 = *(double *)(&DAT_00135690 + (ulong)(row == N) * 8);
    }
    for (; col <= N; col = col + 1) {
      dVar3 = cos((double)((local_7c * (longdouble)(int)col) / local_88));
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_70,
                          row,col);
      dVar4 = 2.0;
      if (col != 0) {
        dVar4 = *(double *)(&DAT_00135690 + (ulong)(N == col) * 8);
      }
      *pSVar2 = (2.0 / (dVar4 * local_b8 * local_58)) * dVar3;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_70,
                          row,col);
      SVar1 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_70,
                          col,row);
      *pSVar2 = SVar1;
    }
  }
  dst = std::
        map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
        ::operator[](&this->matrices,&local_a0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (dst,&local_70);
  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void build(std::size_t N) {
            Eigen::MatrixXd L(N + 1, N + 1); ///< Matrix of coefficients
            for (int j = 0; j <= N; ++j) {
                for (int k = j; k <= N; ++k) {
                    double p_j = (j == 0 || j == N) ? 2 : 1;
                    double p_k = (k == 0 || k == N) ? 2 : 1;
                    L(j, k) = 2.0 / (p_j*p_k*N)*cos((j*EIGEN_PI*k) / N);
                    // Exploit symmetry to fill in the symmetric elements in the matrix
                    L(k, j) = L(j, k);
                }
            }
            matrices[N] = L;
        }